

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  string *psVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string tLocation;
  string depLocation;
  string name;
  undefined1 local_d8 [32];
  size_type local_b8;
  pointer local_b0;
  string local_a8;
  string *local_88;
  string local_80;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&local_50,inName);
  if (local_50._M_string_length == 0) {
    bVar4 = false;
    goto LAB_00282f0b;
  }
  cmsys::SystemTools::GetFilenameLastExtension((string *)local_d8,&local_50);
  iVar5 = std::__cxx11::string::compare(local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (iVar5 == 0) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_d8,&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  this_00 = FindGeneratorTargetToUse(this,&local_50);
  if (this_00 == (cmGeneratorTarget *)0x0) {
LAB_00282d35:
    bVar3 = true;
    bVar4 = true;
  }
  else {
    bVar4 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar4) {
      local_d8._0_8_ = local_d8 + 0x10;
      local_d8._8_8_ = (pointer)0x0;
      local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
      TVar6 = cmGeneratorTarget::GetType(this_00);
      local_88 = dep;
      if ((-1 < (int)TVar6) && (TVar6 = cmGeneratorTarget::GetType(this_00), (int)TVar6 < 4)) {
        cmGeneratorTarget::GetLocation(this_00,config);
        std::__cxx11::string::_M_assign((string *)local_d8);
        cmsys::SystemTools::GetFilenamePath(&local_80,(string *)local_d8);
        std::__cxx11::string::operator=((string *)local_d8,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
        cmsys::SystemTools::CollapseFullPath(&local_80,(string *)local_d8);
        std::__cxx11::string::operator=((string *)local_d8,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
      }
      paVar1 = &local_a8.field_2;
      pcVar2 = (inName->_M_dataplus)._M_p;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + inName->_M_string_length);
      cmsys::SystemTools::GetFilenamePath(&local_80,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::CollapseFullPath(&local_a8,&local_80);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      bVar4 = true;
      if (local_80._M_string_length == local_d8._8_8_) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_string_length ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = false;
        }
        else {
          iVar5 = bcmp(local_80._M_dataplus._M_p,(void *)local_d8._0_8_,local_80._M_string_length);
          bVar4 = iVar5 != 0;
        }
      }
      if (!bVar4) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
        dep = local_88;
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        goto LAB_00282cd8;
      }
      std::__cxx11::string::_M_assign((string *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      dep = local_88;
      if (!bVar4) goto LAB_00282cd8;
LAB_00282d2e:
      bVar4 = true;
      bVar3 = false;
    }
    else {
LAB_00282cd8:
      TVar6 = cmGeneratorTarget::GetType(this_00);
      if (UNKNOWN_LIBRARY < TVar6) goto LAB_00282d35;
      if ((0x10fU >> (TVar6 & 0x1f) & 1) != 0) {
        cmGeneratorTarget::GetFullPath((string *)local_d8,this_00,config,RuntimeBinaryArtifact,true)
        ;
        std::__cxx11::string::operator=((string *)dep,(string *)local_d8);
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        goto LAB_00282d2e;
      }
      bVar3 = false;
      bVar4 = false;
    }
  }
  if (bVar3) {
    bVar4 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar4) {
      bVar4 = true;
      std::__cxx11::string::_M_assign((string *)dep);
    }
    else {
      this_01 = cmMakefile::GetSource(this->Makefile,inName,Ambiguous);
      if (this_01 == (cmSourceFile *)0x0) {
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)local_d8,&(this->super_cmOutputConverter).StateSnapshot);
        psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_d8);
        local_d8._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_d8._0_8_ = psVar7->_M_string_length;
        paVar1 = &local_80.field_2;
        local_80._M_dataplus._M_p = &DAT_00000001;
        local_80.field_2._M_local_buf[0] = '/';
        local_d8._16_8_ = 1;
        local_b0 = (inName->_M_dataplus)._M_p;
        local_b8 = inName->_M_string_length;
        views._M_len = 3;
        views._M_array = (iterator)local_d8;
        local_d8._24_8_ = paVar1;
        local_80._M_string_length = (size_type)paVar1;
        cmCatViews_abi_cxx11_(&local_a8,views);
        std::__cxx11::string::operator=((string *)dep,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        bVar4 = cmsys::SystemTools::FileExists(dep);
        if (!bVar4) {
          cmStateSnapshot::GetDirectory
                    ((cmStateDirectory *)local_d8,&(this->super_cmOutputConverter).StateSnapshot);
          psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_d8);
          local_d8._8_8_ = (psVar7->_M_dataplus)._M_p;
          local_d8._0_8_ = psVar7->_M_string_length;
          local_80._M_dataplus._M_p = &DAT_00000001;
          local_80.field_2._M_local_buf[0] = '/';
          local_d8._16_8_ = 1;
          local_b0 = (inName->_M_dataplus)._M_p;
          local_b8 = inName->_M_string_length;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_d8;
          local_d8._24_8_ = paVar1;
          local_80._M_string_length = (size_type)paVar1;
          cmCatViews_abi_cxx11_(&local_a8,views_00);
          std::__cxx11::string::operator=((string *)dep,(string *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
        cmsys::SystemTools::CollapseFullPath((string *)local_d8,dep,psVar7);
        std::__cxx11::string::operator=((string *)dep,(string *)local_d8);
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        bVar4 = true;
      }
      else {
        cmSourceFile::ResolveFullPath(this_01,(string *)0x0,(string *)0x0);
        bVar4 = true;
        std::__cxx11::string::_M_assign((string *)dep);
      }
    }
  }
LAB_00282f0b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name.empty()) {
    return false;
  }
  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName)) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact,
                                  /*realname=*/true);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName)) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->ResolveFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = cmStrCat(this->GetCurrentSourceDirectory(), '/', inName);

  // If the in-source path does not exist, assume it instead lives in the
  // binary directory.
  if (!cmSystemTools::FileExists(dep)) {
    dep = cmStrCat(this->GetCurrentBinaryDirectory(), '/', inName);
  }

  dep = cmSystemTools::CollapseFullPath(dep, this->GetBinaryDirectory());

  return true;
}